

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetNonlinear(ARKodeMem ark_mem)

{
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ARKodeMem in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffe8,
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    *(undefined4 *)&in_stack_ffffffffffffffe8->user_data = 0;
    *(undefined4 *)((long)&in_stack_ffffffffffffffe8->user_data + 4) = 1;
    in_stack_ffffffffffffffe8->step_printmem = (ARKTimestepPrintMem)0x3fc999999999999a;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetNonlinear(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set parameters */
  step_mem->linear         = SUNFALSE;
  step_mem->linear_timedep = SUNTRUE;
  step_mem->dgmax          = DGMAX;

  return (ARK_SUCCESS);
}